

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# natpmp.cpp
# Opt level: O0

void __thiscall libtorrent::natpmp::on_reply(natpmp *this,error_code *e,size_t bytes_transferred)

{
  uint uVar1;
  portmap_callback *ppVar2;
  portmap_protocol pVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  uint8_t uVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  protocol_version version_00;
  uint32_t uVar10;
  int v;
  pointer pvVar11;
  pointer __dest;
  size_type sVar12;
  char *pcVar13;
  pointer pmVar14;
  difference_type dVar15;
  unsigned_long uVar16;
  endpoint *ep;
  address *addr;
  char **in_00;
  double __x;
  double __x_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x_01;
  double dVar17;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double __x_02;
  undefined8 in_stack_fffffffffffff770;
  undefined4 uVar18;
  address *local_878;
  char *local_850;
  portmap_protocol local_831;
  portmap_protocol local_819;
  byte local_809;
  strong_typedef<int,_libtorrent::port_mapping_tag,_void> local_7cc;
  error_code local_7c8;
  uint local_7b4;
  undefined1 local_7b0 [8];
  address ext_ip;
  undefined1 auStack_788 [7];
  portmap_protocol proto_1;
  address local_778;
  uint local_754;
  portmap_protocol local_74d;
  int local_74c;
  portmap_protocol proto;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_740;
  duration local_738;
  int local_72c;
  duration<long,_std::ratio<1L,_1L>_> local_728;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_720;
  duration local_718;
  __normal_iterator<libtorrent::natpmp::mapping_t_*,_std::vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>_>
  local_710;
  strong_typedef<int,_libtorrent::port_mapping_tag,_void> local_704;
  __normal_iterator<libtorrent::natpmp::mapping_t_*,_std::vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>_>
  local_700;
  iterator end;
  iterator i;
  reference pmStack_6e8;
  port_mapping_t index;
  mapping_t *m;
  char local_6d8 [4];
  int num_chars;
  char msg [200];
  address_v4 local_5f4;
  address_v6 local_5f0;
  address_v6 local_5d8;
  undefined1 local_5c0 [8];
  address external_addr;
  int public_port;
  int private_port;
  int p;
  portmap_protocol protocol;
  array<char,_12UL> nonce;
  address_v4 local_55c;
  int local_558;
  int local_554;
  int time;
  int lifetime;
  undefined1 local_530 [8];
  error_code ec;
  int result;
  uint8_t cmd;
  pointer pvStack_510;
  int version;
  char *in;
  undefined1 local_4e8 [64];
  mutable_buffer local_4a8;
  undefined1 local_498 [8];
  array<char,_1100UL> msg_buf;
  string local_40;
  undefined1 local_20 [8];
  size_t bytes_transferred_local;
  error_code *e_local;
  natpmp *this_local;
  
  uVar18 = (undefined4)((ulong)in_stack_fffffffffffff770 >> 0x20);
  local_20 = (undefined1  [8])bytes_transferred;
  bytes_transferred_local = (size_t)e;
  e_local = (error_code *)this;
  bVar4 = boost::system::error_code::operator_cast_to_bool(e);
  if (bVar4) {
    bVar4 = should_log(this);
    if (bVar4) {
      boost::system::error_code::message_abi_cxx11_(&local_40,(error_code *)bytes_transferred_local)
      ;
      dVar17 = (double)::std::__cxx11::string::c_str();
      log(this,dVar17);
      ::std::__cxx11::string::~string((string *)&local_40);
    }
  }
  else if ((this->m_abort & 1U) == 0) {
    pvVar11 = ::std::array<char,_1100UL>::data((array<char,_1100UL> *)local_498);
    memcpy(pvVar11,this->m_response_buffer,(size_t)local_20);
    local_4a8 = boost::asio::buffer(this->m_response_buffer,0x44c);
    local_4e8._16_8_ = on_reply;
    local_4e8._24_8_ = 0;
    self((natpmp *)local_4e8);
    ::std::
    bind<void(libtorrent::natpmp::*)(boost::system::error_code_const&,unsigned_long),std::shared_ptr<libtorrent::natpmp>,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
              ((type *)(local_4e8 + 0x20),(offset_in_natpmp_to_subr *)(local_4e8 + 0x10),
               (shared_ptr<libtorrent::natpmp> *)local_4e8,
               (_Placeholder<1> *)&::std::placeholders::_1,
               (_Placeholder<2> *)&::std::placeholders::_2);
    boost::asio::
    basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
    ::
    async_receive_from<boost::asio::mutable_buffer,std::_Bind<void(libtorrent::natpmp::*(std::shared_ptr<libtorrent::natpmp>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,unsigned_long)>>
              ((basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
                *)&this->m_socket,&local_4a8,&this->m_remote,
               (_Bind<void_(libtorrent::natpmp::*(std::shared_ptr<libtorrent::natpmp>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_unsigned_long)>
                *)(local_4e8 + 0x20));
    ::std::
    _Bind<void_(libtorrent::natpmp::*(std::shared_ptr<libtorrent::natpmp>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_unsigned_long)>
    ::~_Bind((_Bind<void_(libtorrent::natpmp::*(std::shared_ptr<libtorrent::natpmp>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_unsigned_long)>
              *)(local_4e8 + 0x20));
    ::std::shared_ptr<libtorrent::natpmp>::~shared_ptr((shared_ptr<libtorrent::natpmp> *)local_4e8);
    bVar4 = boost::asio::ip::operator!=(&this->m_remote,&this->m_nat_endpoint);
    if (bVar4) {
      bVar4 = should_log(this);
      if (bVar4) {
        libtorrent::aux::print_endpoint_abi_cxx11_((string *)&in,(aux *)&this->m_remote,ep);
        dVar17 = (double)::std::__cxx11::string::c_str();
        log(this,dVar17);
        ::std::__cxx11::string::~string((string *)&in);
      }
    }
    else {
      boost::asio::
      basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
      ::cancel(&this->m_send_timer);
      if ((ulong)local_20 < 4) {
        log(this,__x);
      }
      else {
        pvStack_510 = ::std::array<char,_1100UL>::data((array<char,_1100UL> *)local_498);
        bVar5 = libtorrent::aux::read_uint8<char*>(&stack0xfffffffffffffaf0);
        version_00 = (protocol_version)bVar5;
        if ((version_00 == version_natpmp) || (version_00 == version_pcp)) {
          bVar5 = libtorrent::aux::read_uint8<char*>(&stack0xfffffffffffffaf0);
          if (version_00 == version_pcp) {
            bVar5 = bVar5 & 0x7f;
            pvStack_510 = pvStack_510 + 1;
            bVar6 = libtorrent::aux::read_uint8<char*>(&stack0xfffffffffffffaf0);
            ec.cat_._4_4_ = (uint)bVar6;
            dVar17 = extraout_XMM0_Qa;
          }
          else {
            uVar8 = libtorrent::aux::read_uint16<char*>(&stack0xfffffffffffffaf0);
            ec.cat_._4_4_ = (uint)uVar8;
            dVar17 = extraout_XMM0_Qa_00;
          }
          if (ec.cat_._4_4_ == 1) {
            log(this,dVar17);
            boost::system::error_code::error_code((error_code *)local_530);
            local_809 = 0;
            if (this->m_version == version_pcp) {
              boost::asio::
              basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              ::local_endpoint((endpoint_type *)&lifetime,
                               (basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                                *)&this->m_socket,(error_code *)local_530);
              bVar4 = libtorrent::aux::is_v6<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>
                                ((basic_endpoint<boost::asio::ip::udp> *)&lifetime);
              local_809 = bVar4 ^ 0xff;
            }
            if ((local_809 & 1) != 0) {
              this->m_version = version_natpmp;
              time = (this->m_currently_mapping).m_val;
              resend_request(this,(port_mapping_t)time);
              send_get_ip_address_request(this);
            }
          }
          else if (((version_00 == version_natpmp) && ((ulong)local_20 < 0xc)) ||
                  ((version_00 == version_pcp && ((ulong)local_20 < 0x18)))) {
            log(this,dVar17);
          }
          else {
            local_554 = 0;
            if (version_00 == version_pcp) {
              uVar10 = libtorrent::aux::read_uint32<char*>(&stack0xfffffffffffffaf0);
              local_554 = libtorrent::aux::numeric_cast<int,unsigned_int,void>(uVar10);
            }
            uVar10 = libtorrent::aux::read_uint32<char*>(&stack0xfffffffffffffaf0);
            local_558 = libtorrent::aux::numeric_cast<int,unsigned_int,void>(uVar10);
            if (version_00 == version_pcp) {
              pvStack_510 = pvStack_510 + 0xc;
            }
            if ((version_00 == version_natpmp) && (bVar5 == 0x80)) {
              libtorrent::aux::read_v4_address<char*&>((aux *)&local_55c,&stack0xfffffffffffffaf0);
              boost::asio::ip::address::operator=(&this->m_external_ip,&local_55c);
              bVar4 = should_log(this);
              if (bVar4) {
                libtorrent::aux::print_address_abi_cxx11_
                          ((string *)(nonce._M_elems + 4),(aux *)&this->m_external_ip,addr);
                dVar17 = (double)::std::__cxx11::string::c_str();
                log(this,dVar17);
                ::std::__cxx11::string::~string((string *)(nonce._M_elems + 4));
              }
            }
            else if (((version_00 == version_natpmp) && (local_20 != (undefined1  [8])0x10)) ||
                    ((version_00 == version_pcp && (local_20 != (undefined1  [8])0x3c)))) {
              log(this,__x_01);
            }
            else {
              private_port._3_1_ = none;
              if (version_00 == version_pcp) {
                __dest = ::std::array<char,_12UL>::data((array<char,_12UL> *)&p);
                pvVar11 = pvStack_510;
                sVar12 = ::std::array<char,_12UL>::size((array<char,_12UL> *)&p);
                memcpy(__dest,pvVar11,sVar12);
                sVar12 = ::std::array<char,_12UL>::size((array<char,_12UL> *)&p);
                pvStack_510 = pvStack_510 + sVar12;
                uVar7 = libtorrent::aux::read_uint8<char*>(&stack0xfffffffffffffaf0);
                local_819 = tcp;
                if (uVar7 != '\x06') {
                  local_819 = udp;
                }
                private_port._3_1_ = local_819;
                pvStack_510 = pvStack_510 + 3;
              }
              uVar8 = libtorrent::aux::read_uint16<char*>(&stack0xfffffffffffffaf0);
              uVar9 = libtorrent::aux::read_uint16<char*>(&stack0xfffffffffffffaf0);
              external_addr.ipv6_address_.scope_id_._4_4_ = (uint)uVar9;
              if (version_00 == version_natpmp) {
                uVar10 = libtorrent::aux::read_uint32<char*>(&stack0xfffffffffffffaf0);
                local_554 = libtorrent::aux::numeric_cast<int,unsigned_int,void>(uVar10);
              }
              boost::asio::ip::address::address((address *)local_5c0);
              if (version_00 == version_pcp) {
                libtorrent::aux::read_v6_address<char*&>
                          (&local_5d8,(aux *)&stack0xfffffffffffffaf0,in_00);
                boost::asio::ip::address::operator=((address *)local_5c0,&local_5d8);
                boost::asio::ip::address::to_v6(&local_5f0,(address *)local_5c0);
                bVar4 = boost::asio::ip::address_v6::is_v4_mapped(&local_5f0);
                if (bVar4) {
                  boost::asio::ip::address::to_v6((address_v6 *)(msg + 0xc0),(address *)local_5c0);
                  boost::asio::ip::make_address_v4
                            ((ip *)&local_5f4,v4_mapped,(address_v6 *)(msg + 0xc0));
                  boost::asio::ip::address::operator=((address *)local_5c0,&local_5f4);
                }
              }
              if (version_00 == version_natpmp) {
                local_831 = udp;
                if (bVar5 != 0x81) {
                  local_831 = tcp;
                }
                private_port._3_1_ = local_831;
              }
              pcVar13 = version_to_string(version_00);
              if (private_port._3_1_ == udp) {
                local_850 = "udp";
              }
              else {
                local_850 = "tcp";
              }
              v = snprintf(local_6d8,200,
                           "<== port map [ transport: %s protocol: %s local: %d external: %d ttl: %d ]"
                           ,pcVar13,local_850,(ulong)(uint)uVar8,
                           external_addr.ipv6_address_.scope_id_._4_4_,CONCAT44(uVar18,local_554));
              pmStack_6e8 = (reference)0x0;
              i._M_current._4_4_ = -1;
              end = ::std::
                    vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
                    ::begin(&(this->m_mappings).
                             super_vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
                           );
              local_700._M_current =
                   (mapping_t *)
                   ::std::
                   vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
                   ::end(&(this->m_mappings).
                          super_vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
                        );
              while (bVar4 = __gnu_cxx::operator!=(&end,&local_700), dVar17 = extraout_XMM0_Qa_01,
                    bVar4) {
                pmVar14 = __gnu_cxx::
                          __normal_iterator<libtorrent::natpmp::mapping_t_*,_std::vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>_>
                          ::operator->(&end);
                if (((((uint)uVar8 == pmVar14->local_port) &&
                     (pmVar14 = __gnu_cxx::
                                __normal_iterator<libtorrent::natpmp::mapping_t_*,_std::vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>_>
                                ::operator->(&end),
                     private_port._3_1_ == (pmVar14->super_base_mapping).protocol)) &&
                    (pmVar14 = __gnu_cxx::
                               __normal_iterator<libtorrent::natpmp::mapping_t_*,_std::vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>_>
                               ::operator->(&end), (pmVar14->map_sent & 1U) != 0)) &&
                   (pmVar14 = __gnu_cxx::
                              __normal_iterator<libtorrent::natpmp::mapping_t_*,_std::vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>_>
                              ::operator->(&end), (pmVar14->outstanding_request & 1U) != 0)) {
                  if (version_00 == version_pcp) {
                    pmVar14 = __gnu_cxx::
                              __normal_iterator<libtorrent::natpmp::mapping_t_*,_std::vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>_>
                              ::operator->(&end);
                    bVar4 = ::std::operator!=((array<char,_12UL> *)&p,
                                              (array<char,_12UL> *)
                                              &(pmVar14->super_base_mapping).field_0x11);
                    if (bVar4) goto LAB_0042539f;
                  }
                  pmStack_6e8 = __gnu_cxx::
                                __normal_iterator<libtorrent::natpmp::mapping_t_*,_std::vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>_>
                                ::operator*(&end);
                  local_710._M_current =
                       (mapping_t *)
                       ::std::
                       vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
                       ::begin(&(this->m_mappings).
                                super_vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>
                              );
                  dVar15 = __gnu_cxx::operator-(&end,&local_710);
                  libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>::
                  strong_typedef(&local_704,(int)dVar15);
                  i._M_current._4_4_ = local_704.m_val;
                  dVar17 = extraout_XMM0_Qa_02;
                  break;
                }
LAB_0042539f:
                __gnu_cxx::
                __normal_iterator<libtorrent::natpmp::mapping_t_*,_std::vector<libtorrent::natpmp::mapping_t,_std::allocator<libtorrent::natpmp::mapping_t>_>_>
                ::operator++(&end);
              }
              if (pmStack_6e8 == (reference)0x0) {
                uVar16 = libtorrent::aux::numeric_cast<unsigned_long,int,void>(v);
                snprintf(local_6d8 + v,200 - uVar16," not found in map table");
                log(this,__x_02);
              }
              else {
                pmStack_6e8->outstanding_request = false;
                log(this,dVar17);
                if ((external_addr.ipv6_address_.scope_id_._4_4_ == 0) || (local_554 == 0)) {
                  (pmStack_6e8->super_base_mapping).protocol = none;
                }
                else {
                  local_720.__d.__r = (duration)libtorrent::aux::time_now();
                  local_72c = (local_554 * 3) / 4;
                  ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                            ((duration<long,std::ratio<1l,1l>> *)&local_728,&local_72c);
                  local_718.__r = (rep)::std::chrono::operator+(&local_720,&local_728);
                  (pmStack_6e8->super_base_mapping).expires.__d.__r = local_718.__r;
                  (pmStack_6e8->super_base_mapping).external_port =
                       external_addr.ipv6_address_.scope_id_._4_4_;
                  bVar4 = boost::asio::ip::address::is_unspecified((address *)local_5c0);
                  if (!bVar4) {
                    boost::asio::ip::address::operator=
                              (&pmStack_6e8->external_address,(address *)local_5c0);
                  }
                }
                if (ec.cat_._4_4_ == 0) {
                  if ((pmStack_6e8->super_base_mapping).act == add) {
                    ext_ip.ipv6_address_.scope_id_._7_1_ =
                         (pmStack_6e8->super_base_mapping).protocol;
                    if (version_00 == version_pcp) {
                      local_878 = &pmStack_6e8->external_address;
                    }
                    else {
                      local_878 = &this->m_external_ip;
                    }
                    boost::asio::ip::address::address((address *)local_7b0,local_878);
                    pVar3 = ext_ip.ipv6_address_.scope_id_._7_1_;
                    ppVar2 = this->m_callback;
                    local_7b4 = i._M_current._4_4_;
                    uVar1 = (pmStack_6e8->super_base_mapping).external_port;
                    boost::system::error_code::error_code<libtorrent::errors::pcp_errors>
                              (&local_7c8,pcp_success,(type *)0x0);
                    (**ppVar2->_vptr_portmap_callback)
                              (ppVar2,(ulong)local_7b4,local_7b0,(ulong)uVar1,(ulong)pVar3,
                               &local_7c8,0,&this->m_listen_handle);
                  }
                }
                else {
                  local_740.__d.__r = (duration)libtorrent::aux::time_now();
                  local_74c = 2;
                  ::std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>
                            ((duration<long,std::ratio<3600l,1l>> *)&stack0xfffffffffffff8b8,
                             &local_74c);
                  local_738.__r =
                       (rep)::std::chrono::operator+
                                      (&local_740,
                                       (duration<long,_std::ratio<3600L,_1L>_> *)
                                       &stack0xfffffffffffff8b8);
                  (pmStack_6e8->super_base_mapping).expires.__d.__r = local_738.__r;
                  local_74d = (pmStack_6e8->super_base_mapping).protocol;
                  ppVar2 = this->m_callback;
                  local_754 = i._M_current._4_4_;
                  boost::asio::ip::address::address(&local_778);
                  pVar3 = local_74d;
                  _auStack_788 = from_result_code(version_00,ec.cat_._4_4_);
                  (**ppVar2->_vptr_portmap_callback)
                            (ppVar2,(ulong)local_754,&local_778,0,(ulong)pVar3,auStack_788,0,
                             &this->m_listen_handle);
                }
                libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>::
                strong_typedef(&local_7cc,-1);
                (this->m_currently_mapping).m_val = local_7cc.m_val;
                (pmStack_6e8->super_base_mapping).act = none;
                boost::asio::
                basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                ::cancel(&this->m_send_timer);
                update_expiration_timer(this);
                try_next_mapping(this,i._M_current._4_4_);
              }
            }
          }
        }
        else {
          log(this,__x_00);
        }
      }
    }
  }
  return;
}

Assistant:

void natpmp::on_reply(error_code const& e
	, std::size_t const bytes_transferred)
{
	TORRENT_ASSERT(is_single_thread());

	COMPLETE_ASYNC("natpmp::on_reply");

	using namespace libtorrent::aux;
	if (e)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("error on receiving reply: %s"
				, e.message().c_str());
		}
#endif
		return;
	}

	if (m_abort) return;

	ADD_OUTSTANDING_ASYNC("natpmp::on_reply");
	// make a copy of the response packet buffer
	// to avoid overwriting it in the next receive call
	std::array<char, sizeof(m_response_buffer)> msg_buf;
	std::memcpy(msg_buf.data(), m_response_buffer, bytes_transferred);

	m_socket.async_receive_from(boost::asio::buffer(&m_response_buffer[0]
		, sizeof(m_response_buffer))
		, m_remote, std::bind(&natpmp::on_reply, self(), _1, _2));

	if (m_remote != m_nat_endpoint)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("received packet from wrong IP: %s"
				, print_endpoint(m_remote).c_str());
		}
#endif
		return;
	}

	m_send_timer.cancel();

	if (bytes_transferred < 4)
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("received packet of invalid size: %d", int(bytes_transferred));
#endif
		return;
	}

	char* in = msg_buf.data();
	int const version = read_uint8(in);

	if (version != version_natpmp && version != version_pcp)
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("unexpected version: %u", version);
#endif
		return;
	}

	std::uint8_t cmd = read_uint8(in);
	if (version == version_pcp)
	{
		cmd &= 0x7fu;
	}
	int result;
	if (version == version_pcp)
	{
		++in; // reserved
		result = read_uint8(in);
	}
	else
	{
		result = read_uint16(in);
	}

	if (result == errors::pcp_unsupp_version)
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("unsupported version");
#endif
		// ignore errors from local_endpoint
		error_code ec;
		if (m_version == version_pcp && !aux::is_v6(m_socket.local_endpoint(ec)))
		{
			m_version = version_natpmp;
			resend_request(m_currently_mapping);
			send_get_ip_address_request();
		}
		return;
	}

	if ((version == version_natpmp && bytes_transferred < 12)
		|| (version == version_pcp && bytes_transferred < 24))
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("received packet of invalid size: %d", int(bytes_transferred));
#endif
		return;
	}

	int lifetime = 0;
	if (version == version_pcp)
	{
		lifetime = aux::numeric_cast<int>(read_uint32(in));
	}
	int const time = aux::numeric_cast<int>(read_uint32(in));
	if (version == version_pcp) in += 12; // reserved
	TORRENT_UNUSED(time);

	if (version == version_natpmp && cmd == 0x80)
	{
		// public IP request response
		m_external_ip = read_v4_address(in);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			log("<== public IP address [ %s ]", print_address(m_external_ip).c_str());
		}
#endif
		return;

	}

	if ((version == version_natpmp && bytes_transferred != 16)
		|| (version == version_pcp && bytes_transferred != 60))
	{
#ifndef TORRENT_DISABLE_LOGGING
		log("received packet of invalid size: %d", int(bytes_transferred));
#endif
		return;
	}

	std::array<char, 12> nonce;
	portmap_protocol protocol = portmap_protocol::none;
	if (version == version_pcp)
	{
		std::memcpy(nonce.data(), in, nonce.size());
		in += nonce.size();
		int p = read_uint8(in);
		protocol = p == 6 ? portmap_protocol::tcp
			: portmap_protocol::udp;
		in += 3; // reserved
	}
	int const private_port = read_uint16(in);
	int const public_port = read_uint16(in);
	if (version == version_natpmp)
		lifetime = aux::numeric_cast<int>(read_uint32(in));
	address external_addr;
	if (version == version_pcp)
	{
		external_addr = read_v6_address(in);
		if (external_addr.to_v6().is_v4_mapped())
			external_addr = make_address_v4(v4_mapped, external_addr.to_v6());
	}

	if (version == version_natpmp)
	{
		protocol = (cmd - 128 == 1)
			? portmap_protocol::udp
			: portmap_protocol::tcp;
	}

#ifndef TORRENT_DISABLE_LOGGING
	char msg[200];
	int const num_chars = std::snprintf(msg, sizeof(msg), "<== port map ["
		" transport: %s protocol: %s local: %d external: %d ttl: %d ]"
		, version_to_string(protocol_version(version))
		, (protocol == portmap_protocol::udp ? "udp" : "tcp")
		, private_port, public_port, lifetime);
#endif

	mapping_t* m = nullptr;
	port_mapping_t index{-1};
	for (auto i = m_mappings.begin(), end(m_mappings.end()); i != end; ++i)
	{
		if (private_port != i->local_port) continue;
		if (protocol != i->protocol) continue;
		if (!i->map_sent) continue;
		if (!i->outstanding_request) continue;
		if (version == version_pcp && nonce != i->nonce) continue;
		m = &*i;
		index = port_mapping_t(static_cast<int>(i - m_mappings.begin()));
		break;
	}

	if (m == nullptr)
	{
#ifndef TORRENT_DISABLE_LOGGING
		snprintf(msg + num_chars, sizeof(msg) - aux::numeric_cast<std::size_t>(num_chars), " not found in map table");
		log("%s", msg);
#endif
		return;
	}
	m->outstanding_request = false;

#ifndef TORRENT_DISABLE_LOGGING
	log("%s", msg);
#endif

	if (public_port == 0 || lifetime == 0)
	{
		// this means the mapping was
		// successfully closed
		m->protocol = portmap_protocol::none;
	}
	else
	{
		m->expires = aux::time_now() + seconds(lifetime * 3 / 4);
		m->external_port = public_port;
		if (!external_addr.is_unspecified())
			m->external_address = external_addr;
	}

	if (result != 0)
	{
		m->expires = aux::time_now() + hours(2);
		portmap_protocol const proto = m->protocol;
		m_callback.on_port_mapping(port_mapping_t{index}, address(), 0, proto
			, from_result_code(version, result), portmap_transport::natpmp, m_listen_handle);
	}
	else if (m->act == portmap_action::add)
	{
		portmap_protocol const proto = m->protocol;
		address const ext_ip = version == version_pcp ? m->external_address : m_external_ip;
		m_callback.on_port_mapping(port_mapping_t{index}, ext_ip, m->external_port, proto
			, errors::pcp_success, portmap_transport::natpmp, m_listen_handle);
	}

	m_currently_mapping = port_mapping_t{-1};
	m->act = portmap_action::none;
	m_send_timer.cancel();
	update_expiration_timer();
	try_next_mapping(index);
}